

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

string_t duckdb::CastFromBlob::Operation<duckdb::string_t>(string_t input,Vector *vector)

{
  Vector *vector_00;
  ulong uVar1;
  char *in_RCX;
  idx_t len;
  undefined1 *puVar2;
  string_t blob;
  string_t blob_00;
  string_t result;
  undefined1 local_28 [16];
  
  blob.value._0_8_ = input.value._8_8_;
  blob.value.pointer.ptr = (char *)vector;
  vector_00 = (Vector *)Blob::GetStringSize(input.value._0_8_,blob);
  local_28 = (undefined1  [16])StringVector::EmptyString((StringVector *)vector,vector_00,len);
  puVar2 = local_28._8_8_;
  if (local_28._0_4_ < 0xd) {
    puVar2 = local_28 + 4;
  }
  blob_00.value.pointer.ptr = puVar2;
  blob_00.value._0_8_ = blob.value._0_8_;
  Blob::ToString(input.value._0_8_,blob_00,in_RCX);
  uVar1 = (ulong)(uint)local_28._0_4_;
  if (uVar1 < 0xd) {
    switchD_01306cb1::default(local_28 + 4 + uVar1,0,0xc - uVar1);
  }
  else {
    local_28._4_4_ = *(undefined4 *)local_28._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_28;
}

Assistant:

string_t CastFromBlob::Operation(string_t input, Vector &vector) {
	idx_t result_size = Blob::GetStringSize(input);

	string_t result = StringVector::EmptyString(vector, result_size);
	Blob::ToString(input, result.GetDataWriteable());
	result.Finalize();

	return result;
}